

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

QString * waitForError<int,QString>
                    (QString *__return_storage_ptr__,QPromise<int> *promise,QString *initial)

{
  QPromiseBase<int> local_48;
  QPromiseBase<int> local_38;
  undefined1 local_21;
  QString *local_20;
  QString *initial_local;
  QPromise<int> *promise_local;
  QString *error;
  
  local_21 = 0;
  local_20 = initial;
  initial_local = (QString *)promise;
  promise_local = (QPromise<int> *)__return_storage_ptr__;
  QString::QString(__return_storage_ptr__,initial);
  QtPromise::QPromiseBase<int>::
  fail<waitForError<int,QString>(QtPromise::QPromise<int>const&,QString_const&)::_lambda(QString_const&)_1_>
            (&local_48,(anon_class_8_1_a7dec128 *)initial_local);
  QtPromise::QPromiseBase<int>::wait(&local_38,&local_48);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_38);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline E waitForError(const QtPromise::QPromise<T>& promise, const E& initial)
{
    E error(initial);
    promise
        .fail([&](const E& err) {
            error = err;
            return T();
        })
        .wait();
    return error;
}